

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  byte bVar1;
  char *pcVar2;
  long *in_RSI;
  long in_RDI;
  SimpleString groupAndName;
  UtestShell *test;
  SimpleString groupAndNameList;
  TestResult *in_stack_ffffffffffffff38;
  UtestShell *in_stack_ffffffffffffff40;
  TestRegistry *in_stack_ffffffffffffff48;
  SimpleString *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  SimpleString *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  SimpleString *local_28;
  
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  local_28 = *(SimpleString **)(in_RDI + 8);
  while (local_28 != (SimpleString *)0x0) {
    in_stack_ffffffffffffff6f =
         testShouldRun(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38
                      );
    if ((bool)in_stack_ffffffffffffff6f) {
      SimpleString::SimpleString
                ((SimpleString *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      SimpleString::operator+=
                (in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      UtestShell::getGroup((UtestShell *)in_stack_ffffffffffffff38);
      SimpleString::operator+=
                ((SimpleString *)in_stack_ffffffffffffff40,(SimpleString *)in_stack_ffffffffffffff38
                );
      SimpleString::~SimpleString((SimpleString *)0x16ed63);
      SimpleString::operator+=
                (in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      UtestShell::getName((UtestShell *)in_stack_ffffffffffffff38);
      SimpleString::operator+=
                ((SimpleString *)in_stack_ffffffffffffff40,(SimpleString *)in_stack_ffffffffffffff38
                );
      SimpleString::~SimpleString((SimpleString *)0x16edab);
      SimpleString::operator+=
                (in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      in_stack_ffffffffffffff6e =
           SimpleString::contains
                     ((SimpleString *)in_stack_ffffffffffffff40,
                      (SimpleString *)in_stack_ffffffffffffff38);
      if (!(bool)in_stack_ffffffffffffff6e) {
        SimpleString::operator+=
                  ((SimpleString *)in_stack_ffffffffffffff40,
                   (SimpleString *)in_stack_ffffffffffffff38);
        SimpleString::operator+=
                  (in_stack_ffffffffffffff60,
                   (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
      SimpleString::~SimpleString((SimpleString *)0x16ee95);
    }
    in_stack_ffffffffffffff60 = (SimpleString *)(**(code **)(local_28->buffer_ + 0x18))();
    local_28 = in_stack_ffffffffffffff60;
  }
  SimpleString::replace
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  bVar1 = SimpleString::endsWith
                    ((SimpleString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50);
  SimpleString::~SimpleString((SimpleString *)0x16ef27);
  if ((bVar1 & 1) != 0) {
    SimpleString::size((SimpleString *)0x16ef41);
    SimpleString::subString
              ((SimpleString *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
               (size_t)in_stack_ffffffffffffff60,CONCAT17(bVar1,in_stack_ffffffffffffff58));
    SimpleString::operator=
              ((SimpleString *)in_stack_ffffffffffffff40,(SimpleString *)in_stack_ffffffffffffff38);
    SimpleString::~SimpleString((SimpleString *)0x16ef86);
  }
  pcVar2 = SimpleString::asCharString((SimpleString *)0x16efe2);
  (**(code **)(*in_RSI + 0x70))(in_RSI,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x16f00b);
  return;
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}